

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

char * INT_EVmaster_get_contact_list(EVmaster master)

{
  CManager_conflict cm;
  undefined4 uVar1;
  undefined4 uVar2;
  attr_list attrs;
  char *pcVar3;
  attr_list p_Var4;
  
  cm = master->cm;
  uVar1 = attr_atom_from_string("CM_ENET_CONN_TIMEOUT");
  uVar2 = attr_atom_from_string("CM_TRANSPORT");
  attrs = (attr_list)create_attr_list();
  pcVar3 = strdup("enet");
  add_string_attr(attrs,uVar2,pcVar3);
  p_Var4 = INT_CMget_specific_contact_list(cm,attrs);
  if (p_Var4 == (attr_list)0x0) {
    free_attr_list(attrs);
    p_Var4 = INT_CMget_contact_list(cm);
    if (p_Var4 == (attr_list)0x0) {
      CMlisten(cm);
      p_Var4 = INT_CMget_contact_list(cm);
    }
  }
  else {
    add_int_attr(p_Var4,uVar1,60000);
    free_attr_list(attrs);
  }
  if (p_Var4 == (attr_list)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)attr_list_to_string(p_Var4);
  }
  free_attr_list(p_Var4);
  return pcVar3;
}

Assistant:

extern char *INT_EVmaster_get_contact_list(EVmaster master)
{
    attr_list contact_list = NULL;
    CManager cm = master->cm;
    char *tmp = NULL;

    /* use enet transport if available */
#if defined(ENET_FOUND) || defined(ZPL_ENET_AVAILABLE)
    atom_t CM_ENET_CONN_TIMEOUT = attr_atom_from_string("CM_ENET_CONN_TIMEOUT");
    atom_t CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
    (void) CM_TRANSPORT;
    attr_list listen_list = create_attr_list();
#if defined(ENET_FOUND)
    add_string_attr(listen_list, CM_TRANSPORT, strdup("enet"));
#elif defined(ZPL_ENET_AVAILABLE)
    add_string_attr(listen_list, CM_TRANSPORT, strdup("zplenet"));
#endif
    /* and kick up the connection timeout value.  We can wait 60 secs */
    contact_list = INT_CMget_specific_contact_list(cm, listen_list);
    if(contact_list) {
        add_int_attr(contact_list, CM_ENET_CONN_TIMEOUT, 60000);
    }
    free_attr_list(listen_list);
#endif

    if (contact_list == NULL) {
	contact_list = INT_CMget_contact_list(cm);
	if (contact_list == NULL) {
	    CMlisten(cm);
	    contact_list = INT_CMget_contact_list(cm);
	}
    }
    if(contact_list) {
        tmp = attr_list_to_string(contact_list);
    }
    free_attr_list(contact_list);
    return tmp;
}